

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O2

double folded_normal_cdf_inv(double cdf,double a,double b)

{
  ostream *poVar1;
  int iVar2;
  char *pcVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double local_68;
  double local_48;
  double local_20;
  
  dVar4 = 0.0;
  if ((0.0 <= cdf) && (cdf <= 1.0)) {
    if ((cdf != 0.0) || (NAN(cdf))) {
      if ((cdf != 1.0) || (NAN(cdf))) {
        if (0.0 <= a) {
          dVar4 = normal_cdf_inv(cdf,a,b);
        }
        else {
          dVar4 = normal_cdf_inv(cdf,-a,b);
        }
        local_48 = -a;
        dVar4 = r8_max(dVar4,0.0);
        dVar5 = folded_normal_cdf(dVar4,a,b);
        dVar6 = (1.0 - cdf) * 0.5;
        dVar7 = normal_cdf_inv(dVar6,a,b);
        dVar6 = normal_cdf_inv(dVar6,local_48,b);
        dVar6 = r8_max(ABS(dVar7),ABS(dVar6));
        folded_normal_cdf(dVar6,a,b);
        iVar2 = 0;
        while( true ) {
          local_68 = dVar5;
          local_20 = dVar4;
          iVar2 = iVar2 + 1;
          dVar4 = (local_20 + dVar6) * 0.5;
          dVar5 = folded_normal_cdf(dVar4,a,b);
          if (ABS(dVar5 - cdf) < 0.0001) break;
          if (iVar2 == 0x65) {
            std::operator<<((ostream *)&std::cerr," \n");
            std::operator<<((ostream *)&std::cerr,"FOLDED_NORMAL_CDF_INV - Fatal error!\n");
            poVar1 = std::operator<<((ostream *)&std::cerr,"  Iteration limit IT_MAX = ");
            poVar1 = (ostream *)std::ostream::operator<<(poVar1,100);
            pcVar3 = " exceeded.\n";
            goto LAB_0019d510;
          }
          if ((cdf < local_68 || cdf < dVar5) && (dVar5 < cdf || local_68 < cdf)) {
            dVar6 = dVar4;
            dVar4 = local_20;
            dVar5 = local_68;
          }
        }
      }
      else {
        dVar4 = 1e+30;
      }
    }
    return dVar4;
  }
  std::operator<<((ostream *)&std::cerr," \n");
  std::operator<<((ostream *)&std::cerr,"FOLDED_NORMAL_CDF_INV - Fatal error!\n");
  pcVar3 = "  CDF < 0 or 1 < CDF.\n";
  poVar1 = (ostream *)&std::cerr;
LAB_0019d510:
  std::operator<<(poVar1,pcVar3);
  exit(1);
}

Assistant:

double folded_normal_cdf_inv ( double cdf, double a, double b )

//****************************************************************************80
//
//  Purpose:
//
//    FOLDED_NORMAL_CDF_INV inverts the Folded Normal CDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    17 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double CDF, the value of the CDF.
//
//    Input, double A, B, the parameters of the PDF.
//    0.0 <= A,
//    0.0 < B.
//
//    Output, double FOLDED_NORMAL_CDF_INV, the argument of the CDF.
//    0.0 <= X.
//
{
  double cdf1;
  double cdf2;
  double cdf3;
  int it;
  int it_max = 100;
  const double r8_huge = 1.0E+30;
  double tol = 0.0001;
  double x;
  double x1;
  double x2;
  double x3;
  double xa;
  double xb;

  if ( cdf < 0.0 || 1.0 < cdf )
  {
    cerr << " \n";
    cerr << "FOLDED_NORMAL_CDF_INV - Fatal error!\n";
    cerr << "  CDF < 0 or 1 < CDF.\n";
    exit ( 1 );
  }

  if ( cdf == 0.0 )
  {
    x = 0.0;
    return x;
  }
  else if ( 1.0 == cdf )
  {
    x = r8_huge;
    return x;
  }
//
//  Find X1, for which the value of CDF will be too small.
//
  if ( 0.0 <= a )
  {
    x1 = normal_cdf_inv ( cdf, a, b );
  }
  else
  {
    x1 = normal_cdf_inv ( cdf, -a, b );
  }
  x1 = r8_max ( x1, 0.0 );
  cdf1 = folded_normal_cdf ( x1, a, b );
//
//  Find X2, for which the value of CDF will be too big.
//
  cdf2 = ( 1.0 - cdf ) / 2.0;

  xa = normal_cdf_inv ( cdf2, a, b );
  xb = normal_cdf_inv ( cdf2, -a, b );
  x2 = r8_max ( fabs ( xa ), fabs ( xb ) );
  cdf2 = folded_normal_cdf ( x2, a, b );
//
//  Now use bisection.
//
  it = 0;

  for ( ; ; )
  {
    it = it + 1;

    x3 = 0.5 * ( x1 + x2 );
    cdf3 = folded_normal_cdf ( x3, a, b );

    if ( fabs ( cdf3 - cdf ) < tol )
    {
      x = x3;
      break;
    }

    if ( it_max < it )
    {
      cerr << " \n";
      cerr << "FOLDED_NORMAL_CDF_INV - Fatal error!\n";
      cerr << "  Iteration limit IT_MAX = " << it_max << " exceeded.\n";
      exit ( 1 );
    }

    if ( ( cdf3 <= cdf && cdf1 <= cdf ) || ( cdf <= cdf3 && cdf <= cdf1 ) )
    {
      x1 = x3;
      cdf1 = cdf3;
    }
    else
    {
      x2 = x3;
      cdf2 = cdf3;
    }
  }

  return x;
}